

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O3

int __thiscall TPZFrontSym<float>::Local(TPZFrontSym<float> *this,int64_t global)

{
  int iVar1;
  ulong in_RAX;
  long *plVar2;
  int iVar3;
  long lVar4;
  undefined8 uStack_28;
  
  plVar2 = (this->super_TPZFront<float>).fLocal.fStore;
  lVar4 = plVar2[global];
  if (lVar4 == -1) {
    uStack_28 = in_RAX;
    if ((this->super_TPZFront<float>).fFree.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements
        == 0) {
      lVar4 = (this->super_TPZFront<float>).fFront;
      (this->super_TPZFront<float>).fFront = lVar4 + 1;
    }
    else {
      iVar1 = TPZStack<int,_10>::Pop(&(this->super_TPZFront<float>).fFree);
      lVar4 = (long)iVar1;
      plVar2 = (this->super_TPZFront<float>).fLocal.fStore;
    }
    plVar2[global] = lVar4;
    if ((this->super_TPZFront<float>).fMaxFront <= lVar4) {
      iVar1 = (this->super_TPZFront<float>).fExpandRatio;
      iVar3 = iVar1 + (int)lVar4;
      uStack_28 = uStack_28 & 0xffffffff;
      TPZVec<float>::Resize
                (&(this->super_TPZFront<float>).fData,(long)(((iVar1 + (int)lVar4 + 1) * iVar3) / 2)
                 ,(float *)((long)&uStack_28 + 4));
      (this->super_TPZFront<float>).fMaxFront = iVar3;
    }
    if ((this->super_TPZFront<float>).fGlobal.super_TPZVec<long>.fNElements <= lVar4) {
      TPZManVector<long,_10>::Resize(&(this->super_TPZFront<float>).fGlobal,lVar4 + 1);
    }
    (this->super_TPZFront<float>).fGlobal.super_TPZVec<long>.fStore[lVar4] = global;
  }
  return (int)lVar4;
}

Assistant:

void TPZFrontSym<std::complex<long double> >::DecomposeOneEquation(int64_t ieq, TPZEqnArray<std::complex<long double> > &eqnarray)
{
	DebugStop();
}